

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O1

int __thiscall QByteArray::toInt(QByteArray *this,bool *ok,int base)

{
  QLocaleData *this_00;
  bool bVar1;
  int iVar2;
  int in_ECX;
  long lVar3;
  undefined4 in_register_00000014;
  bool bVar4;
  QByteArrayView num;
  QSimpleParsedNumber<long_long> QVar5;
  
  num.m_data._4_4_ = in_register_00000014;
  num.m_data._0_4_ = base;
  this_00 = (QLocaleData *)(this->d).size;
  if (this_00 == (QLocaleData *)0x0) {
    bVar1 = true;
    lVar3 = 0;
  }
  else {
    num.m_size = (qsizetype)(this->d).ptr;
    QVar5 = QLocaleData::bytearrayToLongLong(this_00,num,in_ECX);
    bVar1 = QVar5.used < 1;
    lVar3 = 0;
    if (0 < QVar5.used) {
      lVar3 = QVar5.result;
    }
  }
  bVar4 = (int)lVar3 != lVar3;
  if (ok != (bool *)0x0) {
    *ok = (bool)((bVar4 | bVar1) ^ 1);
  }
  iVar2 = 0;
  if (!(bool)(bVar4 | bVar1)) {
    iVar2 = (int)lVar3;
  }
  return iVar2;
}

Assistant:

int QByteArray::toInt(bool *ok, int base) const
{
    return QtPrivate::toIntegral<int>(qToByteArrayViewIgnoringNull(*this), ok, base);
}